

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::~IfcDoorStyle(IfcDoorStyle *this)

{
  ~IfcDoorStyle((IfcDoorStyle *)
                &this[-1].super_IfcTypeProduct.super_IfcTypeObject.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x10);
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}